

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffflus(fitsfile *fptr,int *status)

{
  int iVar1;
  int local_28;
  int local_24;
  int hdutype;
  int hdunum;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _hdutype = status;
    status_local = &fptr->HDUposition;
    ffghdn(fptr,&local_24);
    iVar1 = ffchdu((fitsfile *)status_local,_hdutype);
    if (0 < iVar1) {
      ffpmsg("ffflus could not close the current HDU.");
    }
    ffflsh((fitsfile *)status_local,0,_hdutype);
    iVar1 = ffgext((fitsfile *)status_local,local_24 + -1,&local_28,_hdutype);
    if (0 < iVar1) {
      ffpmsg("ffflus could not reopen the current HDU.");
    }
    fptr_local._4_4_ = *_hdutype;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffflus(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *status)      /* IO - error status                           */
/*
  Flush all the data in the current FITS file to disk. This ensures that if
  the program subsequently dies, the disk FITS file will be closed correctly.
*/
{
    int hdunum, hdutype;

    if (*status > 0)
        return(*status);

    ffghdn(fptr, &hdunum);     /* get the current HDU number */

    if (ffchdu(fptr,status) > 0)   /* close out the current HDU */
        ffpmsg("ffflus could not close the current HDU.");

    ffflsh(fptr, FALSE, status);  /* flush any modified IO buffers to disk */

    if (ffgext(fptr, hdunum - 1, &hdutype, status) > 0) /* reopen HDU */
        ffpmsg("ffflus could not reopen the current HDU.");

    return(*status);
}